

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Group.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Grouping_StaticGroup(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement *local_98;
  CX3DImporter_NodeElement *ne;
  undefined1 local_88 [8];
  string an;
  uint local_54;
  int idx_end;
  int idx;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&idx_end);
  local_54 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_54 < iVar2; local_54 = local_54 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_54);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_88,(char *)CONCAT44(extraout_var,iVar3),(allocator *)((long)&ne + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&ne + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_54);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      ne._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_54);
        std::__cxx11::string::operator=((string *)&idx_end,(char *)CONCAT44(extraout_var_01,iVar3));
        ne._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"bboxCenter");
        if (bVar1) {
          ne._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"bboxSize");
          if (bVar1) {
            ne._0_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88,"containerField");
            if (bVar1) {
              ne._0_4_ = 4;
            }
            else {
              Throw_IncorrectAttr(this,(string *)local_88);
              ne._0_4_ = 0;
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&idx_end,ENET_Group,&local_98);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,&local_98);
  }
  else {
    ParseHelper_Group_Begin(this,true);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&this->NodeElement_Cur->ID,(string *)(use.field_2._M_local_buf + 8));
    }
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) != 0) {
      ParseHelper_Node_Exit(this);
    }
  }
  std::__cxx11::string::~string((string *)&idx_end);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Grouping_StaticGroup()
{
    std::string def, use;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne;

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin(true);// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
		if(!def.empty()) NodeElement_Cur->ID = def;
		// in grouping set of nodes check X3DMetadataObject is not needed, because it is done in <Scene> parser function.

		// for empty element exit from node in that place
		if(mReader->isEmptyElement()) ParseHelper_Node_Exit();
	}// if(!use.empty()) else
}